

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadVertexes(MapData *map)

{
  double *pdVar1;
  uint uVar2;
  FileReader *pFVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ulong in_RAX;
  long lVar6;
  vertex_t *pvVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  SWORD y;
  SWORD x;
  undefined8 uStack_38;
  
  pFVar3 = map->MapLumps[4].Reader;
  uStack_38 = in_RAX;
  if (pFVar3 == (FileReader *)0x0) {
    numvertexes = 0;
  }
  else {
    uVar2 = (uint)pFVar3->Length;
    numvertexes = uVar2 >> 2;
    numvertexdatas = 0;
    if (3 < uVar2) goto LAB_00562a0d;
  }
  numvertexdatas = 0;
  I_Error("Map has no vertices.\n");
LAB_00562a0d:
  iVar5 = numvertexes;
  uVar10 = (ulong)numvertexes;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar10;
  uVar8 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x38),8) == 0) {
    uVar8 = SUB168(auVar4 * ZEXT816(0x38),0);
  }
  vertexes = (vertex_t *)operator_new__(uVar8);
  if (iVar5 != 0) {
    pvVar7 = vertexes;
    do {
      (pvVar7->p).X = 0.0;
      (pvVar7->p).Y = 0.0;
      pvVar7->viewangle = 0;
      pvVar7->angletime = 0;
      pvVar7->dirty = true;
      pvVar7->numheights = 0;
      pvVar7->numsectors = 0;
      pvVar7->sectors = (sector_t **)0x0;
      pvVar7->heightlist = (float *)0x0;
      pvVar7 = pvVar7 + 1;
    } while (pvVar7 != vertexes + uVar10);
  }
  vertexdatas = (vertexdata_t *)0x0;
  pFVar3 = map->MapLumps[4].Reader;
  map->file = pFVar3;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  if (0 < numvertexes) {
    lVar9 = 0;
    lVar6 = 0;
    do {
      pFVar3 = map->file;
      (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,(long)&uStack_38 + 6,2);
      (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,(long)&uStack_38 + 4,2);
      pdVar1 = (double *)((long)&(vertexes->p).X + lVar9);
      *pdVar1 = (double)((int)((uStack_38 >> 0x30) << 0x10) >> 0x10);
      pdVar1[1] = (double)(int)((long)((uStack_38 >> 0x20) << 0x30) >> 0x30);
      lVar6 = lVar6 + 1;
      lVar9 = lVar9 + 0x38;
    } while (lVar6 < numvertexes);
  }
  return;
}

Assistant:

void P_LoadVertexes (MapData * map)
{
	int i;

	// Determine number of vertices:
	//	total lump length / vertex record length.
	numvertexes = map->Size(ML_VERTEXES) / sizeof(mapvertex_t);
	numvertexdatas = 0;

	if (numvertexes == 0)
	{
		I_Error ("Map has no vertices.\n");
	}

	// Allocate memory for buffer.
	vertexes = new vertex_t[numvertexes];		
	vertexdatas = NULL;

	map->Seek(ML_VERTEXES);
		
	// Copy and convert vertex coordinates, internal representation as fixed.
	for (i = 0; i < numvertexes; i++)
	{
		SWORD x, y;

		(*map->file) >> x >> y;
		vertexes[i].set(double(x), double(y));
	}
}